

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

BVSparseNode * __thiscall
BVSparse<Memory::JitArenaAllocator>::NodeFromIndex
          (BVSparse<Memory::JitArenaAllocator> *this,BVIndex i,Type **prevNextFieldOut,bool create)

{
  bool bVar1;
  BVIndex searchIndex_00;
  BVSparseNode *newNode;
  BVSparseNode *curNode;
  Type *prevNextField;
  BVIndex searchIndex;
  bool create_local;
  Type **prevNextFieldOut_local;
  BVIndex i_local;
  BVSparse<Memory::JitArenaAllocator> *this_local;
  
  searchIndex_00 = BVUnitT<unsigned_long>::Floor(i);
  curNode = *(BVSparseNode **)(this + 0x18);
  newNode = curNode->next;
  if (newNode == (BVSparseNode *)0x0) {
    newNode = *(BVSparseNode **)this;
    curNode = (BVSparseNode *)this;
  }
  else {
    if (newNode->startIndex == searchIndex_00) {
      *prevNextFieldOut = &curNode->next;
      return newNode;
    }
    if (searchIndex_00 < newNode->startIndex) {
      newNode = *(BVSparseNode **)this;
      curNode = (BVSparseNode *)this;
    }
  }
  while( true ) {
    bVar1 = false;
    if (newNode != (BVSparseNode *)0x0) {
      bVar1 = newNode->startIndex < searchIndex_00;
    }
    if (!bVar1) break;
    curNode = newNode;
    newNode = newNode->next;
  }
  if ((newNode == (BVSparseNode *)0x0) || (searchIndex_00 != newNode->startIndex)) {
    if (create) {
      this_local = (BVSparse<Memory::JitArenaAllocator> *)
                   Allocate(this,searchIndex_00,curNode->next);
      curNode->next = (Type)this_local;
      *prevNextFieldOut = &curNode->next;
      *(BVSparseNode **)(this + 0x18) = curNode;
    }
    else {
      this_local = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    }
  }
  else {
    *prevNextFieldOut = &curNode->next;
    *(BVSparseNode **)(this + 0x18) = curNode;
    this_local = (BVSparse<Memory::JitArenaAllocator> *)newNode;
  }
  return (BVSparseNode *)this_local;
}

Assistant:

BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator)** prevNextFieldOut, bool create)
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator)* prevNextField = this->lastUsedNodePrevNextField;
    BVSparseNode* curNode = *prevNextField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    if(curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        this->lastUsedNodePrevNextField = prevNextField;
        return curNode;
    }

    if(!create)
    {
        return nullptr;
    }

    BVSparseNode * newNode = Allocate(searchIndex, *prevNextField);
    *prevNextField = newNode;
    *prevNextFieldOut = prevNextField;
    this->lastUsedNodePrevNextField = prevNextField;
    return newNode;
}